

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall opengv::math::Sturm::findRoots(Sturm *this)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  size_type sVar4;
  reference pvVar5;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  MatrixXd derivative;
  MatrixXd value;
  size_t i;
  size_t k;
  size_t r;
  MatrixXd monomials;
  vector<double,_std::allocator<double>_> *roots;
  EigenBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *in_stack_fffffffffffffe08;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffe10;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe18;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe20;
  unsigned_long *in_stack_fffffffffffffe28;
  value_type vVar6;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffe30;
  double in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  Sturm *in_stack_ffffffffffffff40;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x128abae);
  bracketRoots(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(int *)in_stack_fffffffffffffe20);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffe10,(Index)in_stack_fffffffffffffe08,0x128ac0f);
  *pSVar3 = 1.0;
  for (local_50 = 0; sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RDI),
      local_50 < sVar4; local_50 = local_50 + 1) {
    for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
      for (local_60 = 2; local_60 <= *(ulong *)(in_RSI + 0x20); local_60 = local_60 + 1) {
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           (in_stack_fffffffffffffe10,(Index)in_stack_fffffffffffffe08,0x128acc1);
        dVar1 = *pSVar3;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_50);
        dVar2 = *pvVar5;
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           (in_stack_fffffffffffffe10,(Index)in_stack_fffffffffffffe08,0x128ad25);
        *pSVar3 = dVar1 * dVar2;
      }
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator*
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                  *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_50);
      vVar6 = *pvVar5;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_fffffffffffffe10,(Index)in_stack_fffffffffffffe08,0x128ae55);
      in_stack_fffffffffffffe18 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)*pSVar3;
      in_stack_fffffffffffffe20 =
           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffe10,(Index)in_stack_fffffffffffffe08,0x128ae7f);
      in_stack_fffffffffffffe10 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
           (vVar6 - (double)in_stack_fffffffffffffe18 / *(double *)in_stack_fffffffffffffe20);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_50);
      *pvVar5 = (value_type)in_stack_fffffffffffffe10;
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x128aece);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x128aedb);
    }
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x128af6a);
  return in_RDI;
}

Assistant:

std::vector<double>
opengv::math::Sturm::findRoots()
{
  //bracket the roots
  std::vector<double> roots;
  bracketRoots(roots);

  //pollish
  Eigen::MatrixXd monomials(_dimension,1);
  monomials(_dimension-1,0) = 1.0;

  for(size_t r = 0; r < roots.size(); r++ )
  {
    //Now do Gauss iterations here
    //evaluate all monomials at the left bound
    for(size_t k = 0; k < 5; k++ )
    {
      for(size_t i = 2; i <= _dimension; i++)
        monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*roots[r];

      Eigen::MatrixXd value = _C.row(0) * monomials;
      Eigen::MatrixXd derivative = _C.row(1) * monomials;

      //correction
      roots[r] = roots[r] - (value(0,0)/derivative(0,0));
    }
  }

  return roots;
}